

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O0

result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
* __thiscall
toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>::
invoke<std::__cxx11::string>
          (result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,
          repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>> *this,
          location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *loc)

{
  bool bVar1;
  const_iterator rollback;
  value_type *pvVar2;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_00;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *loc_00
  ;
  region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *v;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_01;
  success<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  undefined1 local_130 [8];
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  rslt_1;
  undefined1 local_c0 [8];
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  rslt;
  size_t i;
  const_iterator first;
  region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> retval;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *loc_local;
  
  region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::region
            ((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&first,
             (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this);
  rollback = location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::iter((location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this);
  loc_00 = extraout_RDX;
  for (rslt.field_1.succ.value.last_._M_current = (const_iterator)(char *)0x0;
      rslt.field_1.succ.value.last_._M_current == (char *)0x0;
      rslt.field_1.succ.value.last_._M_current =
           (const_iterator)((long)rslt.field_1.succ.value.last_._M_current + 1)) {
    in_range<(char)48,(char)57>::invoke<std::__cxx11::string>
              ((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                *)local_c0,(in_range<(char)48,(char)57> *)this,loc_00);
    bVar1 = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
            ::is_err((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                      *)local_c0);
    if (bVar1) {
      location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this,rollback);
      none();
      result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
      ::result(__return_storage_ptr__,
               (failure_type *)((long)&rslt_1.field_1.succ.value.last_._M_current + 7));
    }
    else {
      pvVar2 = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
               ::unwrap((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                         *)local_c0);
      region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator+=((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&first,pvVar2);
    }
    rslt_1.field_1._65_3_ = 0;
    rslt_1.field_1._64_1_ = bVar1;
    result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
    ::~result((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
               *)local_c0);
    if (rslt_1.field_1._64_4_ != 0) goto LAB_00167d7a;
    loc_00 = extraout_RDX_00;
  }
  do {
    in_range<(char)48,(char)57>::invoke<std::__cxx11::string>
              ((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                *)local_130,(in_range<(char)48,(char)57> *)this,loc_00);
    bVar1 = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
            ::is_err((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                      *)local_130);
    if (bVar1) {
      ok<toml::detail::region<std::__cxx11::string>>(&local_178,(toml *)&first,v);
      result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
      ::result(__return_storage_ptr__,&local_178);
      success<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~success(&local_178);
    }
    else {
      pvVar2 = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
               ::unwrap((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                         *)local_130);
      region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator+=((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&first,pvVar2);
    }
    rslt_1.field_1._65_3_ = 0;
    rslt_1.field_1._64_1_ = bVar1;
    result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
    ::~result((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
               *)local_130);
    loc_00 = extraout_RDX_01;
  } while (rslt_1.field_1._64_4_ == 0);
LAB_00167d7a:
  region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~region
            ((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&first);
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc)
    {
        region<Cont> retval(loc);

        const auto first = loc.iter();
        for(std::size_t i=0; i<N; ++i)
        {
            auto rslt = T::invoke(loc);
            if(rslt.is_err())
            {
                loc.reset(first);
                return none();
            }
            retval += rslt.unwrap();
        }
        while(true)
        {
            auto rslt = T::invoke(loc);
            if(rslt.is_err())
            {
                return ok(std::move(retval));
            }
            retval += rslt.unwrap();
        }
    }